

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O1

void __thiscall cmDependsFortran::LocateModules(cmDependsFortran *this)

{
  cmDependsFortranInternals *pcVar1;
  cmMakefile *this_00;
  pointer pbVar2;
  mapped_type *pmVar3;
  _Base_ptr p_Var4;
  _Rb_tree_node_base *p_Var5;
  pointer filename;
  string fname;
  string targetDir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  infoFiles;
  ifstream fin;
  long *local_298 [2];
  long local_288 [2];
  string local_278;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_258;
  string local_238;
  byte abStack_218 [488];
  
  pcVar1 = (this->Internal)._M_t.
           super___uniq_ptr_impl<cmDependsFortranInternals,_std::default_delete<cmDependsFortranInternals>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmDependsFortranInternals_*,_std::default_delete<cmDependsFortranInternals>_>
           .super__Head_base<0UL,_cmDependsFortranInternals_*,_false>._M_head_impl;
  for (p_Var5 = *(_Base_ptr *)((long)&(pcVar1->ObjectInfo)._M_t + 0x18);
      p_Var5 != (_Rb_tree_node_base *)((long)&(pcVar1->ObjectInfo)._M_t + 8U);
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_range_unique<std::_Rb_tree_const_iterator<std::__cxx11::string>>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)(this->Internal)._M_t.
                  super___uniq_ptr_impl<cmDependsFortranInternals,_std::default_delete<cmDependsFortranInternals>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_cmDependsFortranInternals_*,_std::default_delete<cmDependsFortranInternals>_>
                  .super__Head_base<0UL,_cmDependsFortranInternals_*,_false>._M_head_impl,
               p_Var5[3]._M_right,
               (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )&p_Var5[3]._M_parent);
    for (p_Var4 = p_Var5[5]._M_parent; p_Var4 != (_Base_ptr)&p_Var5[4]._M_right;
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&((this->Internal)._M_t.
                              super___uniq_ptr_impl<cmDependsFortranInternals,_std::default_delete<cmDependsFortranInternals>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_cmDependsFortranInternals_*,_std::default_delete<cmDependsFortranInternals>_>
                              .super__Head_base<0UL,_cmDependsFortranInternals_*,_false>.
                             _M_head_impl)->TargetRequires,(key_type *)(p_Var4 + 1));
      pmVar3->_M_string_length = 0;
      *(pmVar3->_M_dataplus)._M_p = '\0';
    }
  }
  if (*(size_t *)
       ((long)&(((this->Internal)._M_t.
                 super___uniq_ptr_impl<cmDependsFortranInternals,_std::default_delete<cmDependsFortranInternals>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmDependsFortranInternals_*,_std::default_delete<cmDependsFortranInternals>_>
                 .super__Head_base<0UL,_cmDependsFortranInternals_*,_false>._M_head_impl)->
               TargetRequires)._M_t + 0x28) != 0) {
    MatchLocalModules(this);
    this_00 = (((this->super_cmDepends).LocalGenerator)->super_cmLocalCommonGenerator).
              super_cmLocalGenerator.Makefile;
    local_258.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
    local_258.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
    local_258.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_238,"CMAKE_TARGET_LINKED_INFO_FILES","");
    cmMakefile::GetDefExpandList(this_00,&local_238,&local_258,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    pbVar2 = local_258.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (local_258.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_258.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      filename = local_258.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      do {
        cmsys::SystemTools::GetFilenamePath(&local_278,filename);
        local_298[0] = local_288;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_298,local_278._M_dataplus._M_p,
                   local_278._M_dataplus._M_p + local_278._M_string_length);
        std::__cxx11::string::append((char *)local_298);
        std::ifstream::ifstream(&local_238,(char *)local_298[0],_S_in);
        if ((abStack_218[*(long *)(local_238._M_dataplus._M_p + -0x18)] & 5) == 0) {
          MatchRemoteModules(this,(istream *)&local_238,&local_278);
        }
        std::ifstream::~ifstream(&local_238);
        if (local_298[0] != local_288) {
          operator_delete(local_298[0],local_288[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
        }
        filename = filename + 1;
      } while (filename != pbVar2);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_258);
  }
  return;
}

Assistant:

void cmDependsFortran::LocateModules()
{
  // Collect the set of modules provided and required by all sources.
  using ObjectInfoMap = cmDependsFortranInternals::ObjectInfoMap;
  ObjectInfoMap const& objInfo = this->Internal->ObjectInfo;
  for (auto const& infoI : objInfo) {
    cmFortranSourceInfo const& info = infoI.second;
    // Include this module in the set provided by this target.
    this->Internal->TargetProvides.insert(info.Provides.begin(),
                                          info.Provides.end());

    for (std::string const& r : info.Requires) {
      this->Internal->TargetRequires[r].clear();
    }
  }

  // Short-circuit for simple targets.
  if (this->Internal->TargetRequires.empty()) {
    return;
  }

  // Match modules provided by this target to those it requires.
  this->MatchLocalModules();

  // Load information about other targets.
  cmMakefile* mf = this->LocalGenerator->GetMakefile();
  std::vector<std::string> infoFiles;
  mf->GetDefExpandList("CMAKE_TARGET_LINKED_INFO_FILES", infoFiles);
  for (std::string const& i : infoFiles) {
    std::string targetDir = cmSystemTools::GetFilenamePath(i);
    std::string fname = targetDir + "/fortran.internal";
    cmsys::ifstream fin(fname.c_str());
    if (fin) {
      this->MatchRemoteModules(fin, targetDir);
    }
  }
}